

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

SPIRVariable * __thiscall
spirv_cross::Compiler::maybe_get_backing_variable(Compiler *this,uint32_t chain)

{
  Variant *pVVar1;
  SPIRVariable *pSVar2;
  SPIRExpression *pSVar3;
  ulong uVar4;
  SPIRAccessChain *pSVar5;
  ulong uVar6;
  
  uVar6 = (ulong)chain;
  if ((uVar6 < (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar1[uVar6].type == TypeVariable)) {
    pSVar2 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar6);
  }
  else {
    pSVar2 = (SPIRVariable *)0x0;
  }
  if (pSVar2 == (SPIRVariable *)0x0) {
    if ((uVar6 < (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar1 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
       pVVar1[uVar6].type == TypeExpression)) {
      pSVar3 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar6);
    }
    else {
      pSVar3 = (SPIRExpression *)0x0;
    }
    if (((pSVar3 == (SPIRExpression *)0x0) ||
        (uVar4 = (ulong)(pSVar3->loaded_from).id,
        (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size <= uVar4)) ||
       (pVVar1 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
       pVVar1[uVar4].type != TypeVariable)) {
      pSVar2 = (SPIRVariable *)0x0;
    }
    else {
      pSVar2 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar4);
    }
    if ((uVar6 < (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar1 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
       pVVar1[uVar6].type == TypeAccessChain)) {
      pSVar5 = Variant::get<spirv_cross::SPIRAccessChain>(pVVar1 + uVar6);
    }
    else {
      pSVar5 = (SPIRAccessChain *)0x0;
    }
    if (pSVar5 != (SPIRAccessChain *)0x0) {
      uVar6 = (ulong)(pSVar5->loaded_from).id;
      if ((uVar6 < (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (pVVar1 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
         pVVar1[uVar6].type == TypeVariable)) {
        pSVar2 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar6);
        return pSVar2;
      }
      pSVar2 = (SPIRVariable *)0x0;
    }
  }
  return pSVar2;
}

Assistant:

SPIRVariable *Compiler::maybe_get_backing_variable(uint32_t chain)
{
	auto *var = maybe_get<SPIRVariable>(chain);
	if (!var)
	{
		auto *cexpr = maybe_get<SPIRExpression>(chain);
		if (cexpr)
			var = maybe_get<SPIRVariable>(cexpr->loaded_from);

		auto *access_chain = maybe_get<SPIRAccessChain>(chain);
		if (access_chain)
			var = maybe_get<SPIRVariable>(access_chain->loaded_from);
	}

	return var;
}